

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericProperty.h
# Opt level: O2

void SetGenericPropertyPtr<Assimp::SharedPostProcessInfo::Base>
               (map<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
                *list,char *szName,Base *value,bool *bWasExisting)

{
  _Base_ptr p_Var1;
  iterator __position;
  uint32_t hash;
  pair<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*> local_30;
  
  if (szName != (char *)0x0) {
    hash = SuperFastHash(szName,0,0);
    __position = std::
                 _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>,_std::_Select1st<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
                 ::find(&list->_M_t,&hash);
    if ((_Rb_tree_header *)__position._M_node == &(list->_M_t)._M_impl.super__Rb_tree_header) {
      if (bWasExisting != (bool *)0x0) {
        *bWasExisting = false;
      }
      local_30.first = hash;
      local_30.second = value;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,Assimp::SharedPostProcessInfo::Base*>,std::_Select1st<std::pair<unsigned_int_const,Assimp::SharedPostProcessInfo::Base*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::SharedPostProcessInfo::Base*>>>
      ::_M_emplace_unique<std::pair<unsigned_int,Assimp::SharedPostProcessInfo::Base*>>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,Assimp::SharedPostProcessInfo::Base*>,std::_Select1st<std::pair<unsigned_int_const,Assimp::SharedPostProcessInfo::Base*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::SharedPostProcessInfo::Base*>>>
                  *)list,&local_30);
    }
    else {
      p_Var1 = __position._M_node[1]._M_parent;
      if (p_Var1 != (_Base_ptr)value) {
        if (p_Var1 != (_Base_ptr)0x0) {
          (**(code **)(*(long *)p_Var1 + 8))();
        }
        __position._M_node[1]._M_parent = (_Base_ptr)value;
      }
      if (value == (Base *)0x0) {
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,Assimp::SharedPostProcessInfo::Base*>,std::_Select1st<std::pair<unsigned_int_const,Assimp::SharedPostProcessInfo::Base*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::SharedPostProcessInfo::Base*>>>
        ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,Assimp::SharedPostProcessInfo::Base*>,std::_Select1st<std::pair<unsigned_int_const,Assimp::SharedPostProcessInfo::Base*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::SharedPostProcessInfo::Base*>>>
                            *)list,__position);
      }
      if (bWasExisting != (bool *)0x0) {
        *bWasExisting = true;
      }
    }
    return;
  }
  __assert_fail("nullptr != szName",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/include/assimp/GenericProperty.h"
                ,0x5d,
                "void SetGenericPropertyPtr(std::map<unsigned int, T *> &, const char *, T *, bool *) [T = Assimp::SharedPostProcessInfo::Base]"
               );
}

Assistant:

inline
void SetGenericPropertyPtr(std::map< unsigned int, T* >& list,
        const char* szName, T* value, bool* bWasExisting = nullptr ) {
    ai_assert(nullptr != szName);
    const uint32_t hash = SuperFastHash(szName);

    typename std::map<unsigned int, T*>::iterator it = list.find(hash);
    if (it == list.end())   {
        if (bWasExisting) {
            *bWasExisting = false;
        }

        list.insert(std::pair<unsigned int,T*>( hash, value ));
        return;
    }
    if ((*it).second != value)  {
        delete (*it).second;
        (*it).second = value;
    }
    if (!value) {
        list.erase(it);
    }
    if (bWasExisting) {
        *bWasExisting = true;
    }
}